

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_func_queue_examples.cpp
# Opt level: O1

void density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::
     func_queue_reentrant_put_samples(ostream *i_ostream)

{
  undefined1 uVar1;
  bool bVar2;
  ostream *poVar3;
  value_type *pvVar4;
  undefined8 *puVar5;
  void *pvVar6;
  int iVar7;
  type return_value;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue;
  double last_val;
  anon_class_8_1_90f47376 func;
  PrintScopeDuration dur;
  undefined1 local_f8 [32];
  __native_type local_d8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 local_98 [8];
  reentrant_put_transaction<Func> rStack_90;
  reentrant_put_transaction<Func> local_78;
  PrintScopeDuration local_58;
  
  PrintScopeDuration::PrintScopeDuration
            (&local_58,i_ostream,"concurrent function queue reentrant put samples");
  local_d8._16_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_d8.__align = 0;
  local_d8._8_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_b0 = &DAT_0000ffef;
  local_a8 = &DAT_0000ffef;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_d8.__data,(anon_class_1_0_00000001 *)local_f8);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_d8.__data,(anon_class_1_0_00000001 *)local_f8);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_d8.__data,(anon_class_1_0_00000001 *)local_f8);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_d8.__data,(anon_class_1_0_00000001 *)local_f8);
  do {
    bVar2 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_reentrant_consume_impl
                      ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                        *)&local_d8);
  } while (bVar2);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&local_d8.__data);
  local_78.m_queue =
       (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)local_98;
  local_98 = (undefined1  [8])0x3ff0000000000000;
  local_d8._16_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_d8.__align = 0;
  local_d8._8_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_b0 = &DAT_0000ffef;
  local_a8 = &DAT_0000ffef;
  iVar7 = 10;
  do {
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
    ::
    reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_&,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_&>
              ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
                *)&local_d8.__data,(anon_class_8_1_90f47376 *)&local_78);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  do {
    density::
    conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_reentrant_consume_impl
              ((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)local_f8,&local_d8);
    uVar1 = local_f8[8];
    if (local_f8[8] == '\0') break;
    poVar3 = std::ostream::_M_insert<double>((double)local_f8._0_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  } while (uVar1 != '\0');
  density::
  conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&local_d8.__data);
  local_d8._16_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_d8.__align = 0;
  local_d8._8_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_b0 = &DAT_0000ffef;
  local_a8 = &DAT_0000ffef;
  local_f8._0_4_ = 7;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_d8.__data,(int *)local_f8);
  bVar2 = density::
          conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_reentrant_consume_impl
                    ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                      *)&local_d8);
  if (!bVar2) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0xf7,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&local_d8.__data);
  local_d8._16_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_d8.__align = 0;
  local_d8._8_8_ = (ControlBlock *)0x0;
  local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_b0 = &DAT_0000ffef;
  local_a8 = &DAT_0000ffef;
  local_78.m_queue =
       (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  local_78.m_put_transaction.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  start_reentrant_push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            ((reentrant_put_transaction<typename_std::decay<Func>::type> *)local_98,&local_d8,
             (Func_conflict *)&local_78);
  local_f8._0_8_ = local_98;
  local_f8._8_8_ = rStack_90.m_queue;
  local_f8._16_8_ = rStack_90.m_put_data.m_control_block;
  local_f8._24_8_ = rStack_90.m_put_data.m_user_storage;
  local_98 = (undefined1  [8])0x0;
  rStack_90.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction
            ((reentrant_put_transaction<Func> *)local_98);
  pvVar4 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     ((reentrant_put_transaction<Func> *)local_f8,(char (*) [12])"Hello world");
  puVar5 = (undefined8 *)
           density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr
                     ((reentrant_put_transaction<Func> *)(local_f8 + 8));
  *puVar5 = pvVar4;
  pvVar4 = density::
           conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     ((reentrant_put_transaction<Func> *)local_f8,
                      (char (*) [18])"\t(I\'m so happy)!!");
  pvVar6 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr
                     ((reentrant_put_transaction<Func> *)(local_f8 + 8));
  *(value_type **)((long)pvVar6 + 8) = pvVar4;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)local_f8);
  bVar2 = density::
          conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_reentrant_consume_impl
                    ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                      *)&local_d8);
  if (bVar2) {
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction
              ((reentrant_put_transaction<Func> *)local_f8);
    density::
    conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::~conc_function_queue
              ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&local_d8.__data);
    local_d8._16_8_ = (ControlBlock *)0x0;
    local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_d8.__align = 0;
    local_d8._8_8_ = (ControlBlock *)0x0;
    local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_b0 = &DAT_0000ffef;
    local_a8 = &DAT_0000ffef;
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
    ::
    start_reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
              ((reentrant_put_transaction<Func> *)local_f8,
               (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
                *)&local_d8.__data);
    local_78.m_queue =
         (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)local_f8._0_8_;
    local_78.m_put_transaction.m_queue =
         (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)local_f8._8_8_;
    local_78.m_put_transaction.m_put_data.m_control_block = (ControlBlock *)local_f8._16_8_;
    local_78.m_put_transaction.m_put_data.m_user_storage = (void *)local_f8._24_8_;
    local_f8._0_8_ =
         (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    local_f8._8_8_ =
         (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction
              ((reentrant_put_transaction<Func> *)local_f8);
    local_98 = (undefined1  [8])local_78.m_queue;
    rStack_90.m_queue = local_78.m_put_transaction.m_queue;
    rStack_90.m_put_data.m_control_block = local_78.m_put_transaction.m_put_data.m_control_block;
    rStack_90.m_put_data.m_user_storage = local_78.m_put_transaction.m_put_data.m_user_storage;
    local_78.m_queue =
         (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    local_78.m_put_transaction.m_queue =
         (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_78);
    pvVar4 = density::
             conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                       ((reentrant_put_transaction<Func> *)local_98,(char (*) [12])"Hello world");
    puVar5 = (undefined8 *)
             density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::element_ptr
                       ((reentrant_put_transaction<Func> *)(local_98 + 8));
    *puVar5 = pvVar4;
    pvVar4 = density::
             conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                       ((reentrant_put_transaction<Func> *)local_98,
                        (char (*) [18])"\t(I\'m so happy)!!");
    pvVar6 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::element_ptr
                       ((reentrant_put_transaction<Func> *)(local_98 + 8));
    *(value_type **)((long)pvVar6 + 8) = pvVar4;
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::commit((reentrant_put_transaction<Func> *)local_98);
    bVar2 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_reentrant_consume_impl
                      ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                        *)&local_d8);
    if (bVar2) {
      density::
      conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::reentrant_put_transaction<Func>::~reentrant_put_transaction
                ((reentrant_put_transaction<Func> *)local_98);
      density::
      conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
      ::~conc_function_queue
                ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                  *)&local_d8.__data);
      PrintScopeDuration::~PrintScopeDuration(&local_58);
      return;
    }
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x135,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  __assert_fail("invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                ,0x117,
                "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
               );
}

Assistant:

static void func_queue_reentrant_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "concurrent function queue reentrant put samples");

            using namespace density;

            {
                //! [conc_function_queue reentrant_push example 1]
                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.reentrant_push([] { std::cout << "Hello"; });
                queue.reentrant_push([] { std::cout << " world"; });
                queue.reentrant_push([] { std::cout << "!!!"; });
                queue.reentrant_push([] { std::cout << std::endl; });
                while (queue.try_reentrant_consume())
                    ;
                //! [conc_function_queue reentrant_push example 1]
            }
            {
                //! [conc_function_queue reentrant_push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                conc_function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.reentrant_push(func);

                while (auto const return_value = queue.try_reentrant_consume())
                    std::cout << *return_value << std::endl;
                //! [conc_function_queue reentrant_push example 2]
            }
            {
                //! [conc_function_queue reentrant_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.template reentrant_emplace<Func>(7);

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [conc_function_queue reentrant_emplace example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_reentrant_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.start_reentrant_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                // now transaction is empty

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [conc_function_queue start_reentrant_push example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_reentrant_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.template start_reentrant_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [conc_function_queue start_reentrant_emplace example 1]
                (void)invoked;
            }
        }